

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

void Js::Exception::RecoverUnusedMemory(void)

{
  ThreadContext *pTVar1;
  
  pTVar1 = ThreadContext::GetContextForCurrentThread();
  if ((pTVar1 != (ThreadContext *)0x0) && (pTVar1->recycler != (Recycler *)0x0)) {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)1073758208>(pTVar1->recycler);
  }
  return;
}

Assistant:

void Exception::RecoverUnusedMemory()
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext)
        {
            Recycler* threadRecycler = threadContext->GetRecycler();
            if (threadRecycler)
            {
                try
                {
                    threadRecycler->CollectNow<CollectOnRecoverFromOutOfMemory>();
                }
                catch (...)
                {
                    // Technically, exception is a valid scenario: we asked to recover mem, and it couldn't.
                    // Do not let the exception leak out.
                }
            }
        }
    }